

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Bool prvTidyAttributeIsMismatched(Node *node,AttVal *attval,TidyDocImpl *doc)

{
  Bool BVar1;
  uint uVar2;
  uint uVar3;
  
  BVar1 = no;
  if (((attval != (AttVal *)0x0 && node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
     ((node->tag->versions & 0x61fff) != 0)) {
    uVar3 = doc->lexer->versionEmitted;
    if (uVar3 == 0) {
      uVar3 = doc->lexer->doctype;
    }
    uVar2 = AttributeVersions(node,attval);
    BVar1 = (Bool)((uVar2 & uVar3) == 0);
  }
  return BVar1;
}

Assistant:

Bool TY_(AttributeIsMismatched)(Node* node, AttVal* attval, TidyDocImpl* doc)
{
    uint doctype;
    
    if (!node || !attval)
        return no;
    
    if (!node->tag)
        return no;
    
    if (!(node->tag->versions & VERS_ALL))
        return no;

    doctype = doc->lexer->versionEmitted == 0 ? doc->lexer->doctype : doc->lexer->versionEmitted;

    if (AttributeVersions(node, attval) & doctype)
        return no;
    
    return yes;
}